

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotPieChart<unsigned_short>
               (char **label_ids,unsigned_short *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  ushort uVar1;
  double dVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  double dVar5;
  double dVar6;
  ImVec4 IVar7;
  bool bVar8;
  ImU32 IVar9;
  ImDrawList *this;
  ImPlotItem *pIVar10;
  ulong uVar11;
  int i;
  int i_1;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double local_d0;
  undefined8 local_c8;
  double local_b0;
  float local_98;
  float fStack_94;
  ImPlotPoint center;
  ImVec4 local_68;
  char buffer [32];
  
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                  ,0x6b2,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = unsigned short]"
                 );
  }
  this = GetPlotDrawList();
  uVar11 = 0;
  uVar12 = (ulong)(uint)count;
  if (count < 1) {
    uVar12 = uVar11;
  }
  local_d0 = 0.0;
  for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    local_d0 = local_d0 + (double)values[uVar11];
  }
  center.x = x;
  center.y = y;
  PushPlotClipRect(0.0);
  local_b0 = local_d0;
  if (!normalize && local_d0 <= 1.0) {
    local_b0 = 1.0;
  }
  local_c8 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
  dVar13 = local_c8;
  for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    uVar1 = values[uVar11];
    dVar2 = ((double)uVar1 / local_b0) * 6.2831854820251465 + dVar13;
    bVar8 = BeginItem(label_ids[uVar11],-1);
    if (bVar8) {
      IVar9 = GImPlot->CurrentItem->Color;
      if (0.5 <= (double)uVar1 / local_b0) {
        dVar14 = (dVar2 - dVar13) * 0.5 + dVar13;
        RenderPieSlice(this,&center,radius,dVar13,dVar14,IVar9);
        dVar13 = dVar14;
      }
      RenderPieSlice(this,&center,radius,dVar13,dVar2,IVar9);
      EndItem();
    }
    dVar13 = dVar2;
  }
  if (fmt != (char *)0x0) {
    if (!normalize && local_d0 <= 1.0) {
      local_d0 = 1.0;
    }
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      pIVar10 = GetItem(label_ids[uVar11]);
      dVar13 = ((double)values[uVar11] / local_d0) * 6.2831854820251465 + local_c8;
      if (pIVar10->Show == true) {
        sprintf(buffer,fmt,SUB84((double)values[uVar11],0));
        IVar3 = ImGui::CalcTextSize(buffer,(char *)0x0,false,-1.0);
        dVar5 = center.x;
        local_c8 = (dVar13 - local_c8) * 0.5 + local_c8;
        dVar2 = cos(local_c8);
        dVar6 = center.y;
        dVar14 = sin(local_c8);
        IVar4 = PlotToPixels(dVar2 * radius * 0.5 + dVar5,dVar6 + dVar14 * radius * 0.5,-1);
        local_68 = ImGui::ColorConvertU32ToFloat4(pIVar10->Color);
        IVar9 = CalcTextColor(&local_68);
        IVar7 = local_68;
        local_98 = IVar3.x;
        fStack_94 = IVar3.y;
        local_c8._0_4_ = IVar4.x;
        local_c8._4_4_ = IVar4.y;
        local_68.y = fStack_94 * -0.5 + local_c8._4_4_;
        local_68.x = local_98 * -0.5 + (float)local_c8;
        local_68._8_8_ = IVar7._8_8_;
        ImDrawList::AddText(this,(ImVec2 *)&local_68,IVar9,buffer,(char *)0x0);
      }
      local_c8 = dVar13;
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = GetCurrentItem()->Color;
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col  = CalcTextColor(ImGui::ColorConvertU32ToFloat4(item->Color));
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}